

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O1

Reals __thiscall Omega_h::get_curvature_metrics(Omega_h *this,Mesh *mesh,Real segment_angle)

{
  int *piVar1;
  Reals *pRVar2;
  double dVar3;
  Alloc *pAVar4;
  double dVar5;
  Int i_3;
  LO LVar6;
  int iVar7;
  Alloc *pAVar8;
  long *plVar9;
  Alloc **ppAVar10;
  long lVar11;
  Alloc **ppAVar12;
  double *pdVar13;
  Int i_10;
  undefined8 uVar14;
  Int i;
  long lVar15;
  void *extraout_RDX;
  Alloc *pAVar16;
  long lVar17;
  Alloc **ppAVar18;
  SurfaceInfo *this_00;
  long lVar19;
  ulong uVar20;
  bool bVar21;
  undefined4 uVar22;
  uint uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  Real d;
  double dVar27;
  Alloc *pAVar28;
  double dVar29;
  Reals RVar30;
  ScopedTimer omega_h_scoped_function_timer;
  Matrix<3,_3> m;
  Matrix<2,_2> c_9;
  Vector<2> l;
  Vector<2> c_10;
  Write<double> out;
  Matrix<2,_2> c;
  Vector<3> c_18;
  size_type __dnew;
  Vector<3> c_16;
  Matrix<2,_3> m_q_inv;
  Matrix<2,_3> surf_frame;
  Real b;
  Real c_2;
  Vector<3> c_25;
  Tensor<2> a_1;
  Vector<2> m_ews;
  Vector<3> c_27;
  Matrix<3,_2> c_20;
  type m_q;
  type f;
  SurfaceInfo surface_info;
  ScopedTimer local_599;
  Alloc *local_598 [2];
  undefined1 local_588 [32];
  undefined8 local_568;
  undefined8 local_560;
  undefined8 local_558;
  Alloc *local_548 [10];
  Write<double> local_4f8;
  Alloc *local_4e8 [2];
  undefined1 local_4d8 [32];
  Alloc *local_4b8 [4];
  ulong local_498;
  double local_490;
  char *local_488;
  Real local_480;
  Alloc *local_478;
  Alloc *pAStack_470;
  undefined1 local_468 [56];
  Alloc *pAStack_430;
  Alloc *local_428;
  undefined8 uStack_420;
  Write<double> local_418;
  Write<double> local_408;
  Alloc *local_3f8 [3];
  SurfaceInfo local_3e0;
  Real local_380;
  Alloc *local_378;
  void *local_370;
  Alloc *local_368 [7];
  undefined8 uStack_330;
  Alloc *local_328 [3];
  pointer pcStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  Alloc *local_2f0;
  double local_2e8;
  long local_2e0;
  pointer local_2d8;
  Alloc *local_2d0;
  Alloc *local_2c8;
  Alloc *local_2c0;
  Alloc *local_2b8;
  Alloc *pAStack_2b0;
  Alloc *local_2a8;
  pointer pcStack_2a0;
  Alloc *local_298 [5];
  double local_270 [4];
  Alloc *local_250;
  undefined8 uStack_248;
  Alloc *local_240 [2];
  double local_230;
  Alloc *local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  Alloc *local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  Alloc *local_1f8 [4];
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  SurfaceInfo local_1c8;
  Real local_168;
  Alloc *local_160;
  void *pvStack_158;
  SurfaceInfo local_150;
  SurfaceInfo local_f0;
  SurfaceInfo local_90;
  
  local_480 = segment_angle;
  get_surface_info(&local_150,mesh);
  LVar6 = Mesh::nverts(mesh);
  uVar23 = mesh->dim_;
  if (3 < uVar23) {
    fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
         ,0x33);
  }
  pRVar2 = &local_3e0.surf_vert_normals;
  local_3e0.surf_vert2vert.write_.shared_alloc_.alloc = (Alloc *)pRVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"");
  Write<double>::Write(&local_4f8,((uVar23 + 1) * uVar23 >> 1) * LVar6,0.0,(string *)&local_3e0);
  if (local_3e0.surf_vert2vert.write_.shared_alloc_.alloc != (Alloc *)pRVar2) {
    operator_delete(local_3e0.surf_vert2vert.write_.shared_alloc_.alloc,
                    (ulong)((long)&(local_3e0.surf_vert_normals.write_.shared_alloc_.alloc)->size +
                           1));
  }
  uVar23 = mesh->dim_;
  if (3 < uVar23) {
    fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
         ,0x33);
  }
  if (uVar23 == 2) {
    SurfaceInfo::SurfaceInfo(&local_f0,&local_150);
    local_418.shared_alloc_.alloc = local_4f8.shared_alloc_.alloc;
    if (((ulong)local_4f8.shared_alloc_.alloc & 7) == 0 &&
        local_4f8.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_418.shared_alloc_.alloc = (Alloc *)((local_4f8.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_4f8.shared_alloc_.alloc)->use_count = (local_4f8.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_418.shared_alloc_.direct_ptr = local_4f8.shared_alloc_.direct_ptr;
    get_curve_curvature_metrics<2>(&local_f0,local_480,&local_418);
    pAVar4 = local_418.shared_alloc_.alloc;
    if (((ulong)local_418.shared_alloc_.alloc & 7) == 0 &&
        local_418.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_418.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_418.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
      }
    }
    this_00 = &local_f0;
  }
  else {
    if (uVar23 != 3) goto LAB_0033b444;
    SurfaceInfo::SurfaceInfo(&local_1c8,&local_150);
    local_168 = local_480;
    local_160 = local_4f8.shared_alloc_.alloc;
    if (((ulong)local_4f8.shared_alloc_.alloc & 7) == 0 &&
        local_4f8.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_160 = (Alloc *)((local_4f8.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_4f8.shared_alloc_.alloc)->use_count = (local_4f8.shared_alloc_.alloc)->use_count + 1;
      }
    }
    pvStack_158 = local_4f8.shared_alloc_.direct_ptr;
    if (((ulong)local_150.surf_vert2vert.write_.shared_alloc_.alloc & 1) == 0) {
      local_498 = (local_150.surf_vert2vert.write_.shared_alloc_.alloc)->size;
    }
    else {
      local_498 = (ulong)local_150.surf_vert2vert.write_.shared_alloc_.alloc >> 3;
    }
    local_478 = (Alloc *)0x5d;
    local_4e8[0] = (Alloc *)(local_4e8 + 2);
    pAVar8 = (Alloc *)std::__cxx11::string::_M_create((ulong *)local_4e8,(ulong)&local_478);
    pAVar4 = local_478;
    local_4d8._0_8_ = local_478;
    local_4e8[0] = pAVar8;
    memcpy(pAVar8,
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
           ,0x5d);
    local_4e8[1] = pAVar4;
    *(undefined1 *)((long)&pAVar4->size + (long)&pAVar8->size) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)local_4e8);
    pAVar4 = (Alloc *)(local_598 + 2);
    pAVar8 = (Alloc *)(plVar9 + 2);
    if ((Alloc *)*plVar9 == pAVar8) {
      local_588._0_8_ = pAVar8->size;
      local_588._8_8_ = plVar9[3];
      local_598[0] = pAVar4;
    }
    else {
      local_588._0_8_ = pAVar8->size;
      local_598[0] = (Alloc *)*plVar9;
    }
    local_598[1] = (Alloc *)plVar9[1];
    *plVar9 = (long)pAVar8;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    local_478 = (Alloc *)local_468;
    std::__cxx11::string::_M_construct((ulong)&local_478,'\x02');
    *(undefined2 *)&local_478->size = 0x3438;
    pAVar8 = (Alloc *)((long)&local_598[1]->size + (long)&pAStack_470->size);
    pAVar16 = (Alloc *)0xf;
    if (local_598[0] != pAVar4) {
      pAVar16 = (Alloc *)local_588._0_8_;
    }
    if (pAVar16 < pAVar8) {
      pAVar16 = (Alloc *)0xf;
      if (local_478 != (Alloc *)local_468) {
        pAVar16 = (Alloc *)local_468._0_8_;
      }
      if (pAVar16 < pAVar8) goto LAB_0033a1af;
      plVar9 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_478,0,(char *)0x0,(ulong)local_598[0]);
    }
    else {
LAB_0033a1af:
      plVar9 = (long *)std::__cxx11::string::_M_append((char *)local_598,(ulong)local_478);
    }
    pAVar8 = (Alloc *)(plVar9 + 2);
    if ((Alloc *)*plVar9 == pAVar8) {
      local_3e0.surf_vert_normals.write_.shared_alloc_.alloc = (Alloc *)pAVar8->size;
      local_3e0.surf_vert_normals.write_.shared_alloc_.direct_ptr = (void *)plVar9[3];
      local_3e0.surf_vert2vert.write_.shared_alloc_.alloc = (Alloc *)pRVar2;
    }
    else {
      local_3e0.surf_vert_normals.write_.shared_alloc_.alloc = (Alloc *)pAVar8->size;
      local_3e0.surf_vert2vert.write_.shared_alloc_.alloc = (Alloc *)*plVar9;
    }
    local_3e0.surf_vert2vert.write_.shared_alloc_.direct_ptr = (void *)plVar9[1];
    *plVar9 = (long)pAVar8;
    plVar9[1] = 0;
    *(undefined1 *)&pAVar8->size = 0;
    begin_code("parallel_for",(char *)local_3e0.surf_vert2vert.write_.shared_alloc_.alloc);
    if (local_3e0.surf_vert2vert.write_.shared_alloc_.alloc != (Alloc *)pRVar2) {
      operator_delete(local_3e0.surf_vert2vert.write_.shared_alloc_.alloc,
                      (ulong)((long)&(local_3e0.surf_vert_normals.write_.shared_alloc_.alloc)->size
                             + 1));
    }
    if (local_478 != (Alloc *)local_468) {
      operator_delete(local_478,(ulong)((long)(size_t *)local_468._0_8_ + 1));
    }
    local_498 = local_498 >> 2;
    if (local_598[0] != pAVar4) {
      operator_delete(local_598[0],(ulong)((long)(size_t *)local_588._0_8_ + 1));
    }
    if (local_4e8[0] != (Alloc *)(local_4e8 + 2)) {
      operator_delete(local_4e8[0],(ulong)((long)(size_t *)local_4d8._0_8_ + 1));
    }
    uVar20 = local_498;
    if (0 < (int)local_498) {
      entering_parallel = '\x01';
      SurfaceInfo::SurfaceInfo(&local_3e0,&local_1c8);
      local_2f0 = (Alloc *)this;
      local_380 = local_168;
      local_378 = local_160;
      local_370 = pvStack_158;
      if ((((ulong)local_160 & 7) == 0 && local_160 != (Alloc *)0x0) &&
         (entering_parallel == '\x01')) {
        local_160->use_count = local_160->use_count + -1;
        local_378 = (Alloc *)(local_160->size * 8 + 1);
      }
      local_160 = (Alloc *)0x0;
      pvStack_158 = (void *)0x0;
      entering_parallel = '\0';
      lVar11 = 0;
      local_488 = "best_norm > EPSILON";
      do {
        local_2e0 = lVar11;
        lVar19 = (lVar11 << 0x20) * 3 >> 0x1d;
        local_588._8_8_ =
             *(double *)((long)local_3e0.surf_vert_IIs.write_.shared_alloc_.direct_ptr + lVar19 + 8)
        ;
        local_598[1] = *(Alloc **)
                        ((long)local_3e0.surf_vert_IIs.write_.shared_alloc_.direct_ptr +
                        lVar19 + 0x10);
        local_598[0] = *(Alloc **)
                        ((long)local_3e0.surf_vert_IIs.write_.shared_alloc_.direct_ptr + lVar19);
        local_588._0_8_ = local_598[1];
        dVar27 = 0.0;
        ppAVar10 = local_598;
        lVar11 = 0;
        do {
          lVar15 = 0;
          dVar5 = dVar27;
          do {
            dVar27 = ABS((double)ppAVar10[lVar15]);
            if (ABS((double)ppAVar10[lVar15]) <= dVar5) {
              dVar27 = dVar5;
            }
            lVar15 = lVar15 + 1;
            dVar5 = dVar27;
          } while (lVar15 == 1);
          ppAVar10 = ppAVar10 + 2;
          bVar21 = lVar11 == 0;
          lVar11 = lVar11 + 1;
        } while (bVar21);
        if (dVar27 <= 1e-10) {
          ppAVar10 = &local_2b8;
          lVar11 = 0;
          do {
            lVar15 = 0;
            do {
              uVar23 = 0x3ff00000;
              if (lVar11 != lVar15) {
                uVar23 = 0;
              }
              ppAVar10[lVar15] = (Alloc *)((ulong)uVar23 << 0x20);
              lVar15 = lVar15 + 1;
            } while (lVar15 == 1);
            ppAVar10 = ppAVar10 + 2;
            bVar21 = lVar11 == 0;
            lVar11 = lVar11 + 1;
          } while (bVar21);
          local_298[0] = (Alloc *)0x0;
          local_298[1] = (Alloc *)0x0;
        }
        else {
          lVar11 = 0;
          do {
            local_368[0] = local_598[lVar11 * 2];
            local_368[1] = local_598[lVar11 * 2 + 1];
            lVar15 = 0;
            do {
              local_328[lVar15] = (Alloc *)((double)local_368[lVar15] / dVar27);
              pAVar4 = local_328[1];
              lVar15 = lVar15 + 1;
            } while (lVar15 == 1);
            local_4e8[lVar11 * 2] = local_328[0];
            local_4e8[lVar11 * 2 + 1] = pAVar4;
            bVar21 = lVar11 == 0;
            lVar11 = lVar11 + 1;
          } while (bVar21);
          dVar5 = (double)local_4e8[0] + (double)local_4d8._8_8_;
          local_2c8 = local_4e8[1];
          local_2d0 = (Alloc *)local_4d8._0_8_;
          local_2c0 = local_4e8[0];
          local_2d8 = (pointer)local_4d8._8_8_;
          pAVar8 = (Alloc *)(((double)local_4e8[0] * (double)local_4d8._8_8_ -
                             (double)local_4e8[1] * (double)local_4d8._0_8_) * -4.0 + dVar5 * dVar5)
          ;
          pAVar4 = (Alloc *)ABS((double)pAVar8);
          local_468._48_8_ = dVar27;
          pAStack_430 = (Alloc *)0x0;
          if (5e-05 <= (double)pAVar4) {
            pAVar28 = (Alloc *)0x0;
            iVar7 = 0;
            pAVar16 = (Alloc *)0x0;
            if (0.0 < (double)pAVar8) {
              dVar27 = SQRT((double)pAVar8);
              local_428 = pAVar4;
              uStack_420 = 0;
              local_490 = dVar5;
              dVar5 = dVar27;
              if ((double)pAVar8 < 0.0) {
                uStack_330 = 0;
                local_368[6] = pAVar8;
                local_2e8 = dVar27;
                dVar27 = sqrt((double)pAVar8);
                pAVar8 = local_368[6];
                dVar5 = local_2e8;
              }
              pAVar28 = (Alloc *)((dVar27 + local_490) * 0.5);
              if ((double)pAVar8 < 0.0) {
                local_368[6] = pAVar28;
                dVar5 = sqrt((double)pAVar8);
                pAVar28 = local_368[6];
              }
              pAVar16 = (Alloc *)((local_490 - dVar5) * 0.5);
              iVar7 = 2;
              pAVar4 = local_428;
            }
          }
          else {
            pAVar16 = (Alloc *)(dVar5 * 0.5);
            iVar7 = 1;
            pAVar28 = pAVar16;
          }
          dVar27 = (double)local_468._48_8_;
          local_548[0] = pAVar28;
          local_548[1] = pAVar16;
          uVar14 = 0x119;
          if (iVar7 == 1) {
            if (5e-05 <= (double)pAVar4) goto LAB_0033b55e;
            local_548[5] = pAVar28;
            local_548[4] = pAVar28;
            ppAVar10 = local_598;
            lVar11 = 0;
            do {
              lVar15 = 0;
              do {
                uVar23 = 0x3ff00000;
                if (lVar11 != lVar15) {
                  uVar23 = 0;
                }
                ppAVar10[lVar15] = (Alloc *)((ulong)uVar23 << 0x20);
                lVar15 = lVar15 + 1;
              } while (lVar15 == 1);
              ppAVar10 = ppAVar10 + 2;
              bVar21 = lVar11 == 0;
              lVar11 = lVar11 + 1;
            } while (bVar21);
            local_328[2] = (Alloc *)local_588._0_8_;
            pcStack_310 = (pointer)local_588._8_8_;
            local_328[0] = local_598[0];
            local_328[1] = local_598[1];
          }
          else {
            if (iVar7 != 2) {
LAB_0033b55e:
              local_488 = "nroots == 1 && roots_obj.mults[0] == 2";
LAB_0033b541:
              fail("assertion %s failed at %s +%d\n",local_488,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_eigen.hpp"
                   ,uVar14);
            }
            lVar11 = 0;
            do {
              pAVar4 = local_548[lVar11];
              local_598[0] = local_2c0;
              local_598[1] = local_2c8;
              local_588._0_8_ = local_2d0;
              local_588._8_8_ = local_2d8;
              lVar15 = 0;
              ppAVar10 = local_598;
              do {
                *ppAVar10 = (Alloc *)((double)*ppAVar10 - (double)pAVar4);
                lVar15 = lVar15 + 0x10;
                ppAVar10 = ppAVar10 + 3;
              } while (lVar15 == 0x10);
              local_4d8._0_8_ = local_588._0_8_;
              local_4d8._8_8_ = local_588._8_8_;
              local_4e8[0] = local_598[0];
              local_4e8[1] = local_598[1];
              ppAVar10 = local_4e8;
              ppAVar12 = local_598;
              lVar15 = 0;
              do {
                lVar17 = 0;
                do {
                  *(undefined8 *)((long)ppAVar12 + lVar17) =
                       *(undefined8 *)((long)ppAVar10 + lVar17 * 2);
                  lVar17 = lVar17 + 8;
                } while (lVar17 == 8);
                ppAVar12 = ppAVar12 + 2;
                ppAVar10 = ppAVar10 + 1;
                bVar21 = lVar15 == 0;
                lVar15 = lVar15 + 1;
              } while (bVar21);
              dVar5 = (double)local_598[1] * (double)local_598[1] +
                      (double)local_598[0] * (double)local_598[0];
              local_428 = pAVar4;
              if (dVar5 < 0.0) {
                dVar5 = sqrt(dVar5);
              }
              else {
                dVar5 = SQRT(dVar5);
              }
              dVar3 = (double)local_588._8_8_ * (double)local_588._8_8_ +
                      (double)local_588._0_8_ * (double)local_588._0_8_;
              if (dVar3 < 0.0) {
                local_490 = dVar5;
                dVar3 = sqrt(dVar3);
                dVar5 = local_490;
              }
              else {
                dVar3 = SQRT(dVar3);
              }
              dVar27 = (double)local_468._48_8_;
              dVar29 = dVar3;
              if (dVar3 <= dVar5) {
                dVar29 = dVar5;
              }
              if (dVar29 <= 1e-10) {
                uVar14 = 0xd3;
                goto LAB_0033b541;
              }
              local_368[0] = local_598[(ulong)(dVar5 < dVar3) * 2];
              local_368[1] = local_598[(ulong)(dVar5 < dVar3) * 2 + 1];
              lVar15 = 0;
              do {
                local_4e8[lVar15] = (Alloc *)((double)local_368[lVar15] / dVar29);
                lVar15 = lVar15 + 1;
              } while (lVar15 == 1);
              local_328[lVar11 * 2] = (Alloc *)((ulong)local_4e8[1] ^ 0x8000000000000000);
              local_328[lVar11 * 2 + 1] = local_4e8[0];
              local_548[lVar11 + 4] = local_428;
              bVar21 = lVar11 == 0;
              lVar11 = lVar11 + 1;
            } while (bVar21);
          }
          local_2a8 = local_328[2];
          pcStack_2a0 = pcStack_310;
          local_2b8 = local_328[0];
          pAStack_2b0 = local_328[1];
          local_4e8[0] = local_548[4];
          local_4e8[1] = local_548[5];
          lVar11 = 0;
          do {
            local_598[lVar11] = (Alloc *)((double)local_4e8[lVar11] * dVar27);
            lVar11 = lVar11 + 1;
          } while (lVar11 == 1);
          local_298[0] = local_598[0];
          local_298[1] = local_598[1];
          uVar20 = local_498;
        }
        lVar11 = local_2e0;
        lVar15 = 0;
        do {
          local_270[lVar15 + 4] =
               ((double)local_298[lVar15] / local_380) * ((double)local_298[lVar15] / local_380);
          lVar15 = lVar15 + 1;
        } while (lVar15 == 1);
        dVar27 = *(double *)
                  ((long)local_3e0.surf_vert_normals.write_.shared_alloc_.direct_ptr + lVar19 + 0x10
                  );
        dVar5 = *(double *)
                 ((long)local_3e0.surf_vert_normals.write_.shared_alloc_.direct_ptr + lVar19);
        dVar3 = *(double *)
                 ((long)local_3e0.surf_vert_normals.write_.shared_alloc_.direct_ptr + lVar19 + 8);
        dVar29 = (double)((ulong)dVar27 & 0x8000000000000000 | (ulong)DAT_00454ff0);
        dVar27 = -1.0 / (dVar27 + dVar29);
        local_588._8_8_ = dVar3 * dVar5 * dVar27;
        local_598[0] = (Alloc *)(dVar29 * dVar5 * dVar5 * dVar27 + 1.0);
        local_598[1] = (Alloc *)(dVar29 * (double)local_588._8_8_);
        local_588._0_8_ = -dVar29 * dVar5;
        local_588._16_8_ = dVar3 * dVar3 * dVar27 + dVar29;
        local_588._24_8_ = -dVar3;
        ppAVar10 = local_328;
        lVar19 = 0;
        ppAVar12 = local_598;
        do {
          lVar15 = 0;
          ppAVar18 = ppAVar12;
          do {
            ppAVar10[lVar15] = *ppAVar18;
            lVar15 = lVar15 + 1;
            ppAVar18 = ppAVar18 + 3;
          } while (lVar15 == 1);
          lVar19 = lVar19 + 1;
          ppAVar10 = ppAVar10 + 2;
          ppAVar12 = ppAVar12 + 1;
        } while (lVar19 != 3);
        local_588._16_8_ = local_308;
        local_588._24_8_ = uStack_300;
        local_588._0_8_ = local_328[2];
        local_588._8_8_ = pcStack_310;
        local_598[0] = local_328[0];
        local_598[1] = local_328[1];
        lVar19 = 0;
        do {
          pAVar4 = local_598[lVar19 * 2];
          pAVar8 = local_598[lVar19 * 2 + 1];
          local_548[0] = local_2b8;
          local_548[1] = pAStack_2b0;
          lVar15 = 0;
          do {
            local_4e8[lVar15] = (Alloc *)((double)local_548[lVar15] * (double)pAVar4);
            pAVar28 = local_4e8[1];
            pAVar16 = local_4e8[0];
            lVar15 = lVar15 + 1;
          } while (lVar15 == 1);
          local_548[0] = local_2a8;
          local_548[1] = (Alloc *)pcStack_2a0;
          lVar15 = 0;
          do {
            local_4e8[lVar15] = (Alloc *)((double)local_548[lVar15] * (double)pAVar8);
            lVar15 = lVar15 + 1;
          } while (lVar15 == 1);
          local_548[0] = pAVar16;
          local_548[1] = pAVar28;
          local_548[4] = local_4e8[0];
          local_548[5] = local_4e8[1];
          lVar15 = 0;
          do {
            local_4e8[lVar15] = (Alloc *)((double)local_548[lVar15] + (double)local_548[lVar15 + 4])
            ;
            lVar15 = lVar15 + 1;
          } while (lVar15 == 1);
          local_368[lVar19 * 2] = local_4e8[0];
          local_368[lVar19 * 2 + 1] = local_4e8[1];
          lVar19 = lVar19 + 1;
        } while (lVar19 != 3);
        local_588._16_8_ = local_368[4];
        local_588._24_8_ = local_368[5];
        local_588._0_8_ = local_368[2];
        local_588._8_8_ = local_368[3];
        local_598[0] = local_368[0];
        local_598[1] = local_368[1];
        ppAVar10 = &local_478;
        ppAVar12 = local_598;
        lVar19 = 0;
        do {
          lVar15 = 0;
          do {
            *(undefined8 *)((long)ppAVar10 + lVar15) = *(undefined8 *)((long)ppAVar12 + lVar15 * 2);
            lVar15 = lVar15 + 8;
          } while (lVar15 != 0x18);
          ppAVar10 = ppAVar10 + 3;
          ppAVar12 = ppAVar12 + 1;
          bVar21 = lVar19 == 0;
          lVar19 = lVar19 + 1;
        } while (bVar21);
        local_4d8._16_8_ = local_468._16_8_;
        local_4d8._24_8_ = local_468._24_8_;
        local_4d8._0_8_ = local_468._0_8_;
        local_4d8._8_8_ = local_468._8_8_;
        local_4e8[0] = local_478;
        local_4e8[1] = pAStack_470;
        lVar19 = 0;
        do {
          local_588._16_8_ = local_368[4];
          local_588._24_8_ = local_368[5];
          local_588._0_8_ = local_368[2];
          local_588._8_8_ = local_368[3];
          local_598[0] = local_368[0];
          local_598[1] = local_368[1];
          local_548[4] = local_4e8[lVar19 * 3];
          local_548[5] = local_4e8[lVar19 * 3 + 1];
          local_548[6] = local_4e8[lVar19 * 3 + 2];
          local_4b8[0] = local_368[0];
          local_4b8[1] = local_368[1];
          lVar15 = 0;
          do {
            local_548[lVar15 + 7] = (Alloc *)((double)local_4b8[lVar15] * (double)local_548[4]);
            lVar15 = lVar15 + 1;
          } while (lVar15 == 1);
          uVar25 = SUB84(local_548[7],0);
          uVar26 = (undefined4)((ulong)local_548[7] >> 0x20);
          uVar22 = SUB84(local_548[8],0);
          uVar24 = (undefined4)((ulong)local_548[8] >> 0x20);
          lVar15 = 1;
          do {
            pAVar4 = local_548[lVar15 + 4];
            local_4b8[0] = local_598[lVar15 * 2];
            local_4b8[1] = local_598[lVar15 * 2 + 1];
            lVar17 = 0;
            do {
              local_548[lVar17 + 7] = (Alloc *)((double)local_4b8[lVar17] * (double)pAVar4);
              lVar17 = lVar17 + 1;
            } while (lVar17 == 1);
            local_4b8[0] = (Alloc *)CONCAT44(uVar26,uVar25);
            local_4b8[1] = (Alloc *)CONCAT44(uVar24,uVar22);
            local_3f8[0] = local_548[7];
            local_3f8[1] = local_548[8];
            lVar17 = 0;
            do {
              local_548[lVar17 + 7] =
                   (Alloc *)((double)local_4b8[lVar17] + (double)local_3f8[lVar17]);
              pAVar4 = local_548[8];
              lVar17 = lVar17 + 1;
            } while (lVar17 == 1);
            uVar25 = SUB84(local_548[7],0);
            uVar26 = (undefined4)((ulong)local_548[7] >> 0x20);
            uVar22 = SUB84(local_548[8],0);
            uVar24 = (undefined4)((ulong)local_548[8] >> 0x20);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          local_548[lVar19 * 2] = local_548[7];
          local_548[lVar19 * 2 + 1] = pAVar4;
          bVar21 = lVar19 == 0;
          lVar19 = lVar19 + 1;
        } while (bVar21);
        local_598[0] = local_548[3];
        local_598[1] = (Alloc *)((ulong)local_548[1] ^ 0x8000000000000000);
        local_588._0_8_ = -(double)local_548[2];
        local_588._8_8_ = local_548[0];
        lVar19 = 0;
        do {
          local_548[7] = local_598[lVar19 * 2];
          local_548[8] = local_598[lVar19 * 2 + 1];
          lVar15 = 0;
          do {
            local_548[lVar15 + 4] =
                 (Alloc *)((double)local_548[lVar15 + 7] /
                          ((double)local_548[0] * (double)local_548[3] -
                          (double)local_548[1] * (double)local_548[2]));
            lVar15 = lVar15 + 1;
          } while (lVar15 == 1);
          local_4e8[lVar19 * 2] = local_548[4];
          local_4e8[lVar19 * 2 + 1] = local_548[5];
          pAVar4 = local_378;
          bVar21 = lVar19 == 0;
          lVar19 = lVar19 + 1;
        } while (bVar21);
        lVar19 = 0;
        do {
          pAVar8 = local_4e8[lVar19 * 2];
          pAVar16 = local_4e8[lVar19 * 2 + 1];
          local_588._0_8_ = local_468._0_8_;
          local_598[0] = local_478;
          local_598[1] = pAStack_470;
          lVar15 = 0;
          do {
            local_3f8[lVar15] = (Alloc *)((double)local_598[lVar15] * (double)pAVar8);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          local_588._0_8_ = local_468._24_8_;
          local_598[0] = (Alloc *)local_468._8_8_;
          local_598[1] = (Alloc *)local_468._16_8_;
          lVar15 = 0;
          do {
            local_4b8[lVar15] = (Alloc *)((double)local_598[lVar15] * (double)pAVar16);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          local_588._0_8_ = local_4b8[2];
          local_598[0] = local_4b8[0];
          local_598[1] = local_4b8[1];
          local_548[4] = local_3f8[0];
          local_548[5] = local_3f8[1];
          local_548[6] = local_3f8[2];
          lVar15 = 0;
          do {
            local_548[lVar15 + 7] =
                 (Alloc *)((double)local_548[lVar15 + 4] + (double)local_598[lVar15]);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          local_3f8[0] = local_548[7];
          local_3f8[1] = local_548[8];
          local_3f8[2] = local_548[9];
          local_1f8[lVar19 * 3 + 2] = local_548[9];
          local_1f8[lVar19 * 3] = local_548[7];
          local_1f8[lVar19 * 3 + 1] = local_548[8];
          bVar21 = lVar19 == 0;
          lVar19 = lVar19 + 1;
        } while (bVar21);
        local_598[0] = local_250;
        local_598[1] = (Alloc *)uStack_248;
        local_270[1] = 0.0;
        local_270[2] = 0.0;
        pdVar13 = local_270;
        lVar19 = 0;
        do {
          *pdVar13 = (double)local_598[lVar19];
          lVar19 = lVar19 + 1;
          pdVar13 = pdVar13 + 3;
        } while (lVar19 == 1);
        lVar19 = 0;
        do {
          dVar27 = local_270[lVar19 * 2];
          dVar5 = local_270[lVar19 * 2 + 1];
          local_588._0_8_ = local_1f8[2];
          local_598[0] = local_1f8[0];
          local_598[1] = local_1f8[1];
          lVar15 = 0;
          do {
            local_4b8[lVar15] = (Alloc *)((double)local_598[lVar15] * dVar27);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          local_588._0_8_ = local_1d0;
          local_598[0] = local_1f8[3];
          local_598[1] = (Alloc *)uStack_1d8;
          lVar15 = 0;
          do {
            local_548[lVar15 + 7] = (Alloc *)((double)local_598[lVar15] * dVar5);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          local_588._0_8_ = local_548[9];
          local_598[0] = local_548[7];
          local_598[1] = local_548[8];
          local_548[0] = local_4b8[0];
          local_548[1] = local_4b8[1];
          local_548[2] = local_4b8[2];
          lVar15 = 0;
          do {
            local_548[lVar15 + 4] = (Alloc *)((double)local_548[lVar15] + (double)local_598[lVar15])
            ;
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          local_4b8[0] = local_548[4];
          local_4b8[1] = local_548[5];
          local_4b8[2] = local_548[6];
          local_1f8[lVar19 * 3 + -4] = local_548[6];
          local_1f8[lVar19 * 3 + -6] = local_548[4];
          local_1f8[lVar19 * 3 + -5] = local_548[5];
          bVar21 = lVar19 == 0;
          lVar19 = lVar19 + 1;
        } while (bVar21);
        lVar19 = 0;
        do {
          pAVar8 = local_368[lVar19 * 2];
          pAVar16 = local_368[lVar19 * 2 + 1];
          local_548[2] = (Alloc *)local_218;
          local_548[0] = local_228;
          local_548[1] = (Alloc *)uStack_220;
          lVar15 = 0;
          do {
            local_298[lVar15 + 2] = (Alloc *)((double)local_548[lVar15] * (double)pAVar8);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          local_548[2] = (Alloc *)local_200;
          local_548[0] = local_210;
          local_548[1] = (Alloc *)uStack_208;
          lVar15 = 0;
          do {
            local_270[lVar15 + 6] = (double)local_548[lVar15] * (double)pAVar16;
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          local_548[2] = (Alloc *)local_230;
          local_548[0] = local_240[0];
          local_548[1] = local_240[1];
          local_548[4] = local_298[2];
          local_548[5] = local_298[3];
          local_548[6] = local_298[4];
          lVar15 = 0;
          do {
            local_548[lVar15 + 7] =
                 (Alloc *)((double)local_548[lVar15 + 4] + (double)local_548[lVar15]);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 3);
          local_298[2] = local_548[7];
          local_298[3] = local_548[8];
          local_298[4] = local_548[9];
          local_598[lVar19 * 3 + 2] = local_548[9];
          local_598[lVar19 * 3] = local_548[7];
          local_598[lVar19 * 3 + 1] = local_548[8];
          lVar19 = lVar19 + 1;
        } while (lVar19 != 3);
        lVar19 = (long)*(int *)((long)local_3e0.surf_vert2vert.write_.shared_alloc_.direct_ptr +
                               lVar11 * 4) * 0x30;
        *(Alloc **)((long)local_370 + lVar19) = local_598[0];
        *(undefined8 *)((long)local_370 + lVar19 + 8) = local_588._16_8_;
        *(undefined8 *)((long)local_370 + lVar19 + 0x10) = local_558;
        *(undefined8 *)((long)local_370 + lVar19 + 0x18) = local_588._8_8_;
        *(undefined8 *)((long)local_370 + lVar19 + 0x20) = local_560;
        *(undefined8 *)((long)local_370 + lVar19 + 0x28) = local_568;
        lVar11 = lVar11 + 1;
      } while ((int)lVar11 != (int)uVar20);
      if (((ulong)local_378 & 7) == 0 && local_378 != (Alloc *)0x0) {
        piVar1 = &local_378->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_378);
          operator_delete(pAVar4,0x48);
        }
      }
      SurfaceInfo::~SurfaceInfo(&local_3e0);
      this = (Omega_h *)local_2f0;
    }
    ScopedTimer::~ScopedTimer(&local_599);
    SurfaceInfo::SurfaceInfo(&local_90,&local_150);
    local_408.shared_alloc_.alloc = local_4f8.shared_alloc_.alloc;
    if (((ulong)local_4f8.shared_alloc_.alloc & 7) == 0 &&
        local_4f8.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_408.shared_alloc_.alloc = (Alloc *)((local_4f8.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_4f8.shared_alloc_.alloc)->use_count = (local_4f8.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_408.shared_alloc_.direct_ptr = local_4f8.shared_alloc_.direct_ptr;
    get_curve_curvature_metrics<3>(&local_90,local_480,&local_408);
    pAVar4 = local_408.shared_alloc_.alloc;
    if (((ulong)local_408.shared_alloc_.alloc & 7) == 0 &&
        local_408.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_408.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_408.shared_alloc_.alloc);
        operator_delete(pAVar4,0x48);
      }
    }
    SurfaceInfo::~SurfaceInfo(&local_90);
    pAVar4 = local_160;
    if (((ulong)local_160 & 7) == 0 && local_160 != (Alloc *)0x0) {
      piVar1 = &local_160->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_160);
        operator_delete(pAVar4,0x48);
      }
    }
    this_00 = &local_1c8;
  }
  SurfaceInfo::~SurfaceInfo(this_00);
LAB_0033b444:
  local_468._32_8_ = local_4f8.shared_alloc_.alloc;
  local_468._40_8_ = local_4f8.shared_alloc_.direct_ptr;
  if ((((ulong)local_4f8.shared_alloc_.alloc & 7) == 0 &&
       local_4f8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_4f8.shared_alloc_.alloc)->use_count = (local_4f8.shared_alloc_.alloc)->use_count + -1;
    local_468._32_8_ = (local_4f8.shared_alloc_.alloc)->size * 8 + 1;
  }
  local_4f8.shared_alloc_.alloc = (Alloc *)0x0;
  local_4f8.shared_alloc_.direct_ptr = (void *)0x0;
  Read<double>::Read((Read<signed_char> *)this,(Write<double> *)(local_468 + 0x20));
  uVar14 = local_468._32_8_;
  if ((local_468._32_8_ & 7) == 0 && (Alloc *)local_468._32_8_ != (Alloc *)0x0) {
    piVar1 = (int *)(local_468._32_8_ + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_468._32_8_);
      operator_delete((void *)uVar14,0x48);
    }
  }
  pAVar4 = local_4f8.shared_alloc_.alloc;
  if (((ulong)local_4f8.shared_alloc_.alloc & 7) == 0 &&
      local_4f8.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_4f8.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_4f8.shared_alloc_.alloc);
      operator_delete(pAVar4,0x48);
    }
  }
  SurfaceInfo::~SurfaceInfo(&local_150);
  RVar30.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar30.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar30.write_.shared_alloc_;
}

Assistant:

Reals get_curvature_metrics(Mesh* mesh, Real segment_angle) {
  auto surface_info = get_surface_info(mesh);
  auto out = Write<Real>(mesh->nverts() * symm_ncomps(mesh->dim()), 0.0);
  if (mesh->dim() == 3) {
    /* this algorithm creates degenerate metrics that only specify size in
       the two tangential directions to mesh surfaces */
    auto f = OMEGA_H_LAMBDA(LO const surf_vert) {
      auto const II = get_symm<2>(surface_info.surf_vert_IIs, surf_vert);
      auto const II_decomp = decompose_eigen(II);
      Vector<2> m_ews;
      for (Int i = 0; i < 2; ++i) {
        m_ews[i] = square(II_decomp.l[i] / segment_angle);
      }
      auto const n = get_vector<3>(surface_info.surf_vert_normals, surf_vert);
      auto const frame = form_ortho_basis(n);
      Matrix<3, 2> surf_frame_t;
      surf_frame_t[0] = frame[1];
      surf_frame_t[1] = frame[2];
      auto const surf_frame = transpose(surf_frame_t);
      auto const m_q_inv = II_decomp.q * surf_frame;
      auto const m_q = pseudo_invert(m_q_inv);
      auto const m = m_q * diagonal(m_ews) * m_q_inv;
      auto const vert = surface_info.surf_vert2vert[surf_vert];
      set_symm(out, vert, m);
    };
    parallel_for(surface_info.surf_vert2vert.size(), std::move(f));
    get_curve_curvature_metrics<3>(surface_info, segment_angle, out);
  } else if (mesh->dim() == 2) {
    get_curve_curvature_metrics<2>(surface_info, segment_angle, out);
  }
  return out;
}